

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O3

void __thiscall Region_UnderSizedFile_Test::TestBody(Region_UnderSizedFile_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args_1;
  _func_int *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  pointer message;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr_2;
  shared_ptr<unsigned_char> sp;
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  result;
  size_t region_size;
  size_t file_size;
  mem_based_factory factory;
  AssertHelper local_c8;
  undefined1 local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  shared_ptr<pstore::file::in_memory> local_88;
  Region local_78;
  mem_based_factory local_68;
  mem_based_factory local_40;
  
  local_68.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x10;
  local_68.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&DAT_00000020;
  anon_unknown.dwarf_2f8390::Region::make_array(&local_78,0x10);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0026fc10;
  __args_1 = &local_68.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  __gnu_cxx::new_allocator<pstore::file::in_memory>::
  construct<pstore::file::in_memory,std::shared_ptr<unsigned_char>&,unsigned_long_const&,unsigned_long_const&>
            ((new_allocator<pstore::file::in_memory> *)&local_40,(in_memory *)(this_00 + 1),
             (shared_ptr<unsigned_char> *)&local_78,(unsigned_long *)__args_1,
             (unsigned_long *)__args_1);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_88.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in_memory *)(this_00 + 1);
  local_88.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = this_00;
  pstore::region::mem_based_factory::mem_based_factory(&local_40,&local_88,0x20,0x20);
  if (local_88.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pstore::region::mem_based_factory::init(&local_68,(EVP_PKEY_CTX *)&local_40);
  local_c8.data_._0_4_ = 1;
  local_c0 = (undefined1  [8])
             ((long)(local_68.super_factory.full_size_ - (long)local_68.super_factory._vptr_factory)
             >> 4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_b0,"1U","result.size ()",(uint *)&local_c8,(unsigned_long *)local_c0)
  ;
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
               ,0x43,message);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0019b469;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_a8;
  }
  else {
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    if ((_func_int **)local_68.super_factory.full_size_ == local_68.super_factory._vptr_factory) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    p_Var1 = *local_68.super_factory._vptr_factory;
    local_c0 = *(undefined1 (*) [8])
                &((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(p_Var1 + 8))->
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ;
    local_b8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x10);
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
      }
    }
    testing::internal::CmpHelperEQ<std::shared_ptr<unsigned_char>,std::shared_ptr<void_const>>
              ((internal *)local_b0,"sp","region0.data ()",(shared_ptr<unsigned_char> *)&local_78,
               (shared_ptr<const_void> *)local_c0);
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c0);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x46,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    local_c8.data_._0_4_ = 0;
    local_c0 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)(p_Var1 + 0x20))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_b0,"0U","region0.offset ()",(uint *)&local_c8,
               (unsigned_long *)local_c0);
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c0);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x47,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    local_c0 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)(p_Var1 + 0x28))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_b0,"region_size","region0.size ()",(unsigned_long *)&local_68.file_
               ,(unsigned_long *)local_c0);
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c0);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x48,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    local_c0[0] = p_Var1[0x18];
    local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1[0x18] != (_func_int)0x0) goto LAB_0019b469;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_b8;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)local_c0,(AssertionResult *)"region0.is_writable ()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
               ,0x49,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,local_c8.data_._0_4_) + 8))();
    }
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._M_pi;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0019b469;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,local_a8);
LAB_0019b469:
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::~vector((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             *)&local_68);
  if (local_40.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.file_.
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pstore::region::factory::~factory(&local_40.super_factory);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )local_78.super_Test.gtest_flag_saver_._M_t.
        super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.super_Test.gtest_flag_saver_._M_t.
               super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

TEST_F (Region, UnderSizedFile) {
    constexpr std::size_t file_size = 16;
    constexpr std::size_t region_size = 32;

    auto sp = this->make_array (file_size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, file_size, file_size);

    pstore::region::mem_based_factory factory (file, region_size, region_size);
    auto result = factory.init ();

    ASSERT_EQ (1U, result.size ());

    auto const & region0 = *(result.at (0));
    EXPECT_EQ (sp, region0.data ());
    EXPECT_EQ (0U, region0.offset ());
    EXPECT_EQ (region_size, region0.size ());
    EXPECT_TRUE (region0.is_writable ());
}